

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O3

Promise<void> kj::anon_unknown_0::expectRead(AsyncInputStream *in,StringPtr expected)

{
  PromiseNode *pPVar1;
  int iVar2;
  void *pvVar3;
  TransformPromiseNodeBase *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PromiseNode *in_RCX;
  ImmediatePromiseNode<kj::_::Void> *pIVar5;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX_00;
  _func_int **pp_Var6;
  _func_int **elementCount;
  Own<kj::_::ChainPromiseNode> OVar7;
  Own<kj::_::ImmediatePromiseNode<kj::_::Void>_> OVar8;
  Promise<unsigned_long> promise;
  Array<char> buffer;
  Own<kj::_::PromiseNode> local_b8;
  Own<kj::_::PromiseNode> local_a8;
  void *local_98;
  _func_int **pp_Stack_90;
  undefined8 *local_88;
  AsyncInputStream *local_80;
  _func_int **local_78;
  Disposer *pDStack_70;
  PromiseNode *local_68;
  void *local_60;
  _func_int **pp_Stack_58;
  undefined8 *local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  AsyncInputStream *pAVar4;
  
  pp_Var6 = (_func_int **)expected.content.ptr;
  elementCount = (_func_int **)((long)&in_RCX[-1]._vptr_PromiseNode + 7);
  if (elementCount == (_func_int **)0x0) {
    OVar8 = heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_78);
    in->_vptr_AsyncInputStream = local_78;
    in[1]._vptr_AsyncInputStream = (_func_int **)pDStack_70;
  }
  else {
    local_80 = in;
    pvVar3 = _::HeapArrayDisposer::allocateImpl
                       (1,(size_t)elementCount,(size_t)elementCount,(_func_void_void_ptr *)0x0,
                        (_func_void_void_ptr *)0x0);
    local_88 = &_::HeapArrayDisposer::instance;
    local_98 = pvVar3;
    pp_Stack_90 = elementCount;
    (**(code **)(*pp_Var6 + 8))(&local_b8,pp_Var6,pvVar3,1,elementCount);
    local_50 = &_::HeapArrayDisposer::instance;
    local_98 = (void *)0x0;
    pp_Stack_90 = (_func_int **)0x0;
    local_78 = pp_Var6;
    pDStack_70 = (Disposer *)expected.content.size_;
    local_68 = in_RCX;
    local_60 = pvVar3;
    pp_Stack_58 = elementCount;
    this = (TransformPromiseNodeBase *)operator_new(0x58);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this,&local_b8,
               CaptureByMove<kj::(anonymous_namespace)::expectRead(kj::AsyncInputStream&,kj::StringPtr)::$_0,kj::Array<char>>
               ::operator());
    (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0043d608;
    this[1].super_PromiseNode._vptr_PromiseNode = local_78;
    this[1].dependency.disposer = pDStack_70;
    this[1].dependency.ptr = local_68;
    this[1].continuationTracePtr = pvVar3;
    this[2].super_PromiseNode._vptr_PromiseNode = elementCount;
    this[2].dependency.disposer = (Disposer *)&_::HeapArrayDisposer::instance;
    local_60 = (void *)0x0;
    pp_Stack_58 = (_func_int **)0x0;
    local_a8.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,unsigned_long,kj::CaptureByMove<kj::(anonymous_namespace)::expectRead(kj::AsyncInputStream&,kj::StringPtr)::$_0,kj::Array<char>>,kj::_::PropagateException>>
          ::instance;
    local_a8.ptr = (PromiseNode *)this;
    OVar7 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_48,&local_a8);
    pPVar1 = local_a8.ptr;
    pIVar5 = (ImmediatePromiseNode<kj::_::Void> *)OVar7.ptr;
    *(undefined4 *)&local_80->_vptr_AsyncInputStream = local_48;
    *(undefined4 *)((long)&local_80->_vptr_AsyncInputStream + 4) = uStack_44;
    *(undefined4 *)&local_80[1]._vptr_AsyncInputStream = uStack_40;
    *(undefined4 *)((long)&local_80[1]._vptr_AsyncInputStream + 4) = uStack_3c;
    pAVar4 = local_80;
    if ((TransformPromiseNodeBase *)local_a8.ptr != (TransformPromiseNodeBase *)0x0) {
      local_a8.ptr = (PromiseNode *)0x0;
      iVar2 = (**(local_a8.disposer)->_vptr_Disposer)
                        (local_a8.disposer,
                         ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                         (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
      pAVar4 = (AsyncInputStream *)CONCAT44(extraout_var,iVar2);
      pIVar5 = extraout_RDX;
    }
    pPVar1 = local_b8.ptr;
    OVar8.ptr = pIVar5;
    OVar8.disposer = (Disposer *)pAVar4;
    if (local_b8.ptr != (PromiseNode *)0x0) {
      local_b8.ptr = (PromiseNode *)0x0;
      iVar2 = (**(local_b8.disposer)->_vptr_Disposer)
                        (local_b8.disposer,
                         pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
      pp_Var6 = pp_Stack_90;
      pvVar3 = local_98;
      OVar8.disposer._4_4_ = extraout_var_00;
      OVar8.disposer._0_4_ = iVar2;
      OVar8.ptr = extraout_RDX_00;
      if (local_98 != (void *)0x0) {
        local_98 = (void *)0x0;
        pp_Stack_90 = (_func_int **)0x0;
        OVar8 = (Own<kj::_::ImmediatePromiseNode<kj::_::Void>_>)
                (**(code **)*local_88)(local_88,pvVar3,1,pp_Var6,pp_Var6,0);
      }
    }
  }
  return (PromiseBase)(PromiseBase)OVar8;
}

Assistant:

kj::Promise<void> expectRead(kj::AsyncInputStream& in, kj::StringPtr expected) {
  if (expected.size() == 0) return kj::READY_NOW;

  auto buffer = kj::heapArray<char>(expected.size());

  auto promise = in.tryRead(buffer.begin(), 1, buffer.size());
  return promise.then(kj::mvCapture(buffer, [&in,expected](kj::Array<char> buffer, size_t amount) {
    if (amount == 0) {
      KJ_FAIL_ASSERT("expected data never sent", expected);
    }

    auto actual = buffer.slice(0, amount);
    if (memcmp(actual.begin(), expected.begin(), actual.size()) != 0) {
      KJ_FAIL_ASSERT("data from stream doesn't match expected", expected, actual);
    }

    return expectRead(in, expected.slice(amount));
  }));
}